

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

void __thiscall FFlatVertexBuffer::CreateVBO(FFlatVertexBuffer *this)

{
  uint *puVar1;
  uint uVar2;
  FFlatVertex *__dest;
  uint amount;
  
  uVar2 = this->mNumReserved;
  puVar1 = &(this->vbo_shadowdata).Count;
  amount = uVar2 - *puVar1;
  if (*puVar1 <= uVar2 && amount != 0) {
    TArray<FFlatVertex,_FFlatVertex>::Grow(&this->vbo_shadowdata,amount);
  }
  (this->vbo_shadowdata).Count = uVar2;
  CreateFlatVBO(this);
  uVar2 = (this->vbo_shadowdata).Count;
  this->mIndex = uVar2;
  this->mCurIndex = uVar2;
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    __dest = (FFlatVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,40000000,0x22);
    this->map = __dest;
    uVar2 = (this->vbo_shadowdata).Count;
  }
  else {
    __dest = this->map;
  }
  memcpy(__dest,(this->vbo_shadowdata).Array,(ulong)uVar2 * 0x14);
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glUnmapBuffer)(0x8892);
    this->map = (FFlatVertex *)0x0;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateVBO()
{
	vbo_shadowdata.Resize(mNumReserved);
	CreateFlatVBO();
	mCurIndex = mIndex = vbo_shadowdata.Size();
	Map();
	memcpy(map, &vbo_shadowdata[0], vbo_shadowdata.Size() * sizeof(FFlatVertex));
	Unmap();
}